

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status
hrgls_APICreateParametersSetCredentials
          (hrgls_APICreateParams params,uint8_t *credentials,uint32_t size)

{
  hrgls_Status s;
  uint32_t size_local;
  uint8_t *credentials_local;
  hrgls_APICreateParams params_local;
  
  if (params == (hrgls_APICreateParams)0x0) {
    params_local._4_4_ = 0x3ee;
  }
  else {
    if (size == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&params->credentials);
    }
    else {
      if (credentials == (uint8_t *)0x0) {
        return 0x3e9;
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::assign<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&params->credentials,
                 credentials,credentials + size);
    }
    params_local._4_4_ = 0;
  }
  return params_local._4_4_;
}

Assistant:

hrgls_Status hrgls_APICreateParametersSetCredentials(hrgls_APICreateParams params,
    const uint8_t *credentials, uint32_t size)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!params) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!size) {
      params->credentials.clear();
    } else {
      if (!credentials) {
        return hrgls_STATUS_BAD_PARAMETER;
      } else {
        // We have a nonzero size and a non-NULL pointer, so copy the data.
        params->credentials.assign(credentials, credentials + size);
      }
    }
    return s;
  }